

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_utility.h
# Opt level: O2

float imageio::convertSIntToFloat(uint32_t rawBits,uint32_t numBits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = numBits - 1;
  if (uVar3 < 0x20) {
    uVar1 = rawBits & ~(1 << (uVar3 & 0x1f));
    uVar2 = -uVar1;
    if ((rawBits >> (uVar3 & 0x1f) & 1) == 0) {
      uVar2 = uVar1;
    }
    return (float)(int)uVar2;
  }
  __assert_fail("numBits > 0 && numBits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                ,0xbd,"float imageio::convertSIntToFloat(uint32_t, uint32_t)");
}

Assistant:

[[nodiscard]] inline float convertSIntToFloat(uint32_t rawBits, uint32_t numBits) {
    assert(numBits > 0 && numBits <= 32);
    const auto signBit = (rawBits & 1u << (numBits - 1)) != 0;
    const auto valueBits = rawBits & ~(1u << (numBits - 1));
    const auto signedValue = static_cast<int32_t>(valueBits) * (signBit ? -1 : 1);
    return static_cast<float>(signedValue);
}